

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll.c
# Opt level: O3

void poll_dealloc(event_base *base)

{
  undefined8 *ptr;
  
  ptr = (undefined8 *)base->evbase;
  evsig_dealloc_(base);
  if ((void *)ptr[2] != (void *)0x0) {
    event_mm_free_((void *)ptr[2]);
  }
  if ((void *)ptr[3] != (void *)0x0) {
    event_mm_free_((void *)ptr[3]);
  }
  ptr[2] = 0;
  ptr[3] = 0;
  *ptr = 0;
  ptr[1] = 0;
  event_mm_free_(ptr);
  return;
}

Assistant:

static void
poll_dealloc(struct event_base *base)
{
	struct pollop *pop = base->evbase;

	evsig_dealloc_(base);
	if (pop->event_set)
		mm_free(pop->event_set);
	if (pop->event_set_copy)
		mm_free(pop->event_set_copy);

	memset(pop, 0, sizeof(struct pollop));
	mm_free(pop);
}